

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

size_t mime_file_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  FILE *__stream;
  size_t sVar1;
  
  if (nitems == 0) {
    return 0xfffffffffffffffe;
  }
  __stream = *(FILE **)((long)instream + 0x48);
  if (__stream == (FILE *)0x0) {
    __stream = fopen64(*(char **)((long)instream + 0x20),"rb");
    *(FILE **)((long)instream + 0x48) = __stream;
    if (__stream == (FILE *)0x0) {
      return 0xffffffffffffffff;
    }
  }
  sVar1 = fread(buffer,size,nitems,__stream);
  return sVar1;
}

Assistant:

static size_t mime_file_read(char *buffer, size_t size, size_t nitems,
                             void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;

  if(!nitems)
    return STOP_FILLING;

  if(mime_open_file(part))
    return READ_ERROR;

  return fread(buffer, size, nitems, part->fp);
}